

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterXsYs<signed_char> *pGVar7;
  GetterXsYRef<signed_char> *pGVar8;
  ImDrawVert *pIVar9;
  uint *puVar10;
  undefined1 auVar11 [16];
  double dVar12;
  ulong uVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  int iVar17;
  ImPlotContext *gp;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ulong uVar23;
  float fVar24;
  float fVar25;
  float fVar31;
  double dVar32;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  pGVar7 = this->Getter1;
  pGVar8 = this->Getter2;
  iVar17 = pGVar7->Count;
  lVar18 = (long)(((pGVar7->Offset + prim) % iVar17 + iVar17) % iVar17) * (long)pGVar7->Stride;
  iVar17 = this->Transformer->YAxis;
  iVar4 = pGVar8->Count;
  IVar1 = GImPlot->PixelRange[iVar17].Min;
  dVar32 = (double)IVar1.x;
  dVar12 = (double)IVar1.y;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar17].Range.Min;
  dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar19 = (float)(((double)(int)pGVar7->Ys[lVar18] - dVar2) * GImPlot->My[iVar17] + dVar12);
  fVar20 = (float)(((double)(int)((long)((ulong)(byte)pGVar7->Xs[lVar18] << 0x38) >> 0x38) - dVar3)
                   * GImPlot->Mx + dVar32);
  dVar32 = ((double)(int)pGVar8->Xs
                         [(long)(((prim + pGVar8->Offset) % iVar4 + iVar4) % iVar4) *
                          (long)pGVar8->Stride] - dVar3) * GImPlot->Mx + dVar32;
  fVar21 = (float)((pGVar8->YRef - dVar2) * GImPlot->My[iVar17] + dVar12);
  fVar22 = (float)dVar32;
  uVar23 = CONCAT44(-(uint)(fVar22 <= fVar20),-(uint)(fVar21 <= fVar19));
  auVar14._4_8_ = dVar32;
  auVar14._0_4_ = fVar20;
  auVar26._0_8_ = auVar14._0_8_ << 0x20;
  auVar26._8_4_ = fVar19;
  auVar26._12_4_ = fVar20;
  auVar15._4_8_ = auVar26._8_8_;
  auVar15._0_4_ = -(uint)(fVar20 < fVar22);
  auVar27._0_8_ = auVar15._0_8_ << 0x20;
  auVar27._8_4_ = -(uint)(fVar19 < fVar21);
  auVar27._12_4_ = -(uint)(fVar20 < fVar22);
  uVar13 = CONCAT44(fVar20,fVar19) & auVar27._8_8_;
  auVar28._0_8_ = ~uVar23 & CONCAT44(fVar22,fVar21);
  auVar28._8_8_ = ~auVar27._8_8_ & CONCAT44(fVar22,fVar21);
  auVar11._8_4_ = (int)uVar13;
  auVar11._0_8_ = CONCAT44(fVar20,fVar19) & uVar23;
  auVar11._12_4_ = (int)(uVar13 >> 0x20);
  auVar28 = auVar28 | auVar11;
  fVar31 = (cull_rect->Min).x;
  auVar30._4_4_ = -(uint)(fVar31 < auVar28._4_4_);
  auVar30._0_4_ = -(uint)((cull_rect->Min).y < auVar28._0_4_);
  auVar16._4_8_ = auVar28._8_8_;
  auVar16._0_4_ = -(uint)(auVar28._4_4_ < fVar31);
  auVar29._0_8_ = auVar16._0_8_ << 0x20;
  auVar29._8_4_ = -(uint)(auVar28._8_4_ < (cull_rect->Max).y);
  auVar29._12_4_ = -(uint)(auVar28._12_4_ < (cull_rect->Max).x);
  auVar30._8_8_ = auVar29._8_8_;
  iVar17 = movmskps(iVar17 * 0x10,auVar30);
  if (iVar17 == 0xf) {
    IVar5 = this->Col;
    IVar1 = *uv;
    fVar24 = fVar21 - fVar19;
    fVar31 = fVar22 - fVar20;
    fVar25 = fVar31 * fVar31 + fVar24 * fVar24;
    if (0.0 < fVar25) {
      fVar25 = 1.0 / SQRT(fVar25);
      fVar31 = fVar31 * fVar25;
      fVar24 = fVar24 * fVar25;
    }
    fVar25 = this->Weight * 0.5;
    pIVar9 = DrawList->_VtxWritePtr;
    fVar31 = fVar25 * fVar31;
    fVar25 = fVar25 * fVar24;
    (pIVar9->pos).x = fVar25 + fVar20;
    (pIVar9->pos).y = fVar19 - fVar31;
    (pIVar9->uv).x = IVar1.x;
    (pIVar9->uv).y = IVar1.y;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar5;
    pIVar9[1].pos.x = fVar25 + fVar22;
    pIVar9[1].pos.y = fVar21 - fVar31;
    pIVar9[1].uv = IVar1;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar5;
    pIVar9[2].pos.x = fVar22 - fVar25;
    pIVar9[2].pos.y = fVar31 + fVar21;
    pIVar9[2].uv = IVar1;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar5;
    pIVar9[3].pos.x = fVar20 - fVar25;
    pIVar9[3].pos.y = fVar31 + fVar19;
    pIVar9[3].uv = IVar1;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar10 = DrawList->_IdxWritePtr;
    *puVar10 = uVar6;
    puVar10[1] = uVar6 + 1;
    puVar10[2] = DrawList->_VtxCurrentIdx + 2;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar10[3] = uVar6;
    puVar10[4] = uVar6 + 2;
    puVar10[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar10 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }